

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

int flatbuffers::JsonPrinter::GetFieldDefault<int>(FieldDef *fd)

{
  bool bVar1;
  char *s;
  int local_14;
  bool check;
  FieldDef *pFStack_10;
  int val;
  FieldDef *fd_local;
  
  local_14 = 0;
  pFStack_10 = fd;
  s = (char *)std::__cxx11::string::c_str();
  bVar1 = StringToNumber<int>(s,&local_14);
  if (bVar1) {
    return local_14;
  }
  __assert_fail("check",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_text.cpp"
                ,0xfb,
                "static T flatbuffers::JsonPrinter::GetFieldDefault(const FieldDef &) [T = int]");
}

Assistant:

static T GetFieldDefault(const FieldDef &fd) {
    T val{};
    auto check = StringToNumber(fd.value.constant.c_str(), &val);
    (void)check;
    FLATBUFFERS_ASSERT(check);
    return val;
  }